

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::parse_args(int *argc,char **argv,char *verbosity_flag)

{
  char __c;
  Verbosity VVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  byte local_a1;
  char *local_a0;
  char *end;
  Verbosity req_verbosity;
  Text user_msg;
  Text fail_info;
  Text str_right;
  Text str_left;
  int val_right;
  int val_left;
  char *value_str;
  locale local_48 [8];
  size_t local_40;
  size_t arg_len;
  char *cmd;
  int local_28;
  int arg_it;
  int out_argc;
  int arg_dest;
  char *verbosity_flag_local;
  char **argv_local;
  int *argc_local;
  
  arg_it = 1;
  local_28 = *argc;
  cmd._4_4_ = 1;
  _out_argc = verbosity_flag;
  verbosity_flag_local = (char *)argv;
  argv_local = (char **)argc;
  do {
    if (*(int *)argv_local <= cmd._4_4_) {
      *(int *)argv_local = local_28;
      pcVar4 = verbosity_flag_local + (long)*(int *)argv_local * 8;
      pcVar4[0] = '\0';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      return;
    }
    arg_len = *(size_t *)(verbosity_flag_local + (long)cmd._4_4_ * 8);
    local_40 = strlen(_out_argc);
    iVar3 = strncmp((char *)arg_len,_out_argc,local_40);
    local_a1 = 0;
    if (iVar3 == 0) {
      __c = *(char *)(arg_len + local_40);
      std::locale::locale(local_48,"");
      bVar2 = std::isalpha<char>(__c,local_48);
      local_a1 = bVar2 ^ 0xff;
      std::locale::~locale(local_48);
    }
    if ((local_a1 & 1) == 0) {
      *(undefined8 *)(verbosity_flag_local + (long)arg_it * 8) =
           *(undefined8 *)(verbosity_flag_local + (long)cmd._4_4_ * 8);
      VVar1 = g_stderr_verbosity;
      arg_it = arg_it + 1;
    }
    else {
      _val_right = (char *)(arg_len + local_40);
      iVar3 = local_28 + -1;
      if (*_val_right == '\0') {
        str_left._str._4_4_ = cmd._4_4_ + 1;
        str_left._str._0_4_ = *(int *)argv_local;
        cmd._4_4_ = str_left._str._4_4_;
        if ((int)str_left._str <= str_left._str._4_4_) {
          local_28 = local_28 + -1;
          format_value<int>((loguru *)&str_right,(int *)((long)&str_left._str + 4));
          format_value<int>((loguru *)&fail_info,(int *)&str_left);
          pcVar4 = Text::c_str(&str_right);
          pcVar5 = Text::c_str(&fail_info);
          textprintf((char *)&user_msg,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","arg_it","<","argc",
                     pcVar4,"<",pcVar5);
          textprintf(&stack0xffffffffffffff70,"Missing verbosiy level after %s",_out_argc);
          pcVar4 = Text::c_str(&user_msg);
          pcVar5 = Text::c_str((Text *)&stack0xffffffffffffff70);
          log_and_abort(0,pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                        ,0x1c1,"%s",pcVar5);
        }
        _val_right = *(char **)(verbosity_flag_local + (long)str_left._str._4_4_ * 8);
        iVar3 = local_28 + -2;
      }
      local_28 = iVar3;
      if (*_val_right == '=') {
        _val_right = _val_right + 1;
      }
      end._4_4_ = get_verbosity_from_name(_val_right);
      VVar1 = end._4_4_;
      if (end._4_4_ == -10) {
        local_a0 = (char *)0x0;
        lVar6 = strtol(_val_right,&local_a0,10);
        g_stderr_verbosity = (Verbosity)lVar6;
        bVar2 = false;
        if (local_a0 != (char *)0x0) {
          bVar2 = *local_a0 == '\0';
        }
        VVar1 = g_stderr_verbosity;
        if (!bVar2) {
          log_and_abort(0,"CHECK FAILED:  end && *end == \'\\0\'  ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                        ,0x1ce,
                        "Invalid verbosity. Expected integer, INFO, WARNING, ERROR or OFF, got \'%s\'"
                        ,_val_right);
        }
      }
    }
    g_stderr_verbosity = VVar1;
    cmd._4_4_ = cmd._4_4_ + 1;
  } while( true );
}

Assistant:

static void parse_args(int& argc, char* argv[], const char* verbosity_flag)
	{
		int arg_dest = 1;
		int out_argc = argc;

		for (int arg_it = 1; arg_it < argc; ++arg_it) {
			auto cmd = argv[arg_it];
			auto arg_len = strlen(verbosity_flag);
			if (strncmp(cmd, verbosity_flag, arg_len) == 0 && !std::isalpha(cmd[arg_len], std::locale(""))) {
				out_argc -= 1;
				auto value_str = cmd + arg_len;
				if (value_str[0] == '\0') {
					// Value in separate argument
					arg_it += 1;
					CHECK_LT_F(arg_it, argc, "Missing verbosiy level after " LOGURU_FMT(s) "", verbosity_flag);
					value_str = argv[arg_it];
					out_argc -= 1;
				}
				if (*value_str == '=') { value_str += 1; }

				auto req_verbosity = get_verbosity_from_name(value_str);
				if (req_verbosity != Verbosity_INVALID) {
					g_stderr_verbosity = req_verbosity;
				} else {
					char* end = 0;
					g_stderr_verbosity = static_cast<int>(strtol(value_str, &end, 10));
					CHECK_F(end && *end == '\0',
						"Invalid verbosity. Expected integer, INFO, WARNING, ERROR or OFF, got '" LOGURU_FMT(s) "'", value_str);
				}
			} else {
				argv[arg_dest++] = argv[arg_it];
			}
		}

		argc = out_argc;
		argv[argc] = nullptr;
	}